

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

int attachServiceClientTypeToLink(LINK_HANDLE link)

{
  AMQP_VALUE map;
  LOGGER_LOG p_Var1;
  AMQP_VALUE key;
  AMQP_VALUE value;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE serviceClientTypeValue;
  AMQP_VALUE serviceClientTypeKeyName;
  fields attach_properties;
  LINK_HANDLE link_local;
  
  map = amqpvalue_create_map();
  if (map == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"attachServiceClientTypeToLink",0x422,1,
                "Failed to create the map for service client type.");
    }
    l._4_4_ = 0x423;
  }
  else {
    key = amqpvalue_create_symbol("com.microsoft:client-version");
    if (key == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"attachServiceClientTypeToLink",0x429,1,
                  "Failed to create the key name for the service client type.");
      }
      l._4_4_ = 0x42a;
    }
    else {
      value = amqpvalue_create_string("iothubserviceclient/1.1.0");
      if (value == (AMQP_VALUE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"attachServiceClientTypeToLink",0x430,1,
                    "Failed to create the key value for the service client type.");
        }
        l._4_4_ = 0x431;
      }
      else {
        l._4_4_ = amqpvalue_set_map_value(map,key,value);
        if (l._4_4_ == 0) {
          l._4_4_ = link_set_attach_properties(link,map);
          if (l._4_4_ == 0) {
            l._4_4_ = 0;
          }
          else {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"attachServiceClientTypeToLink",0x43b,1,
                        "Unable to attach the service client type to the link properties. Error code is: %d"
                        ,l._4_4_);
            }
          }
        }
        else {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"attachServiceClientTypeToLink",0x437,1,
                      "Failed to set the property map for the service client type.  Error code is: %d"
                      ,l._4_4_);
          }
        }
        amqpvalue_destroy(value);
      }
      amqpvalue_destroy(key);
    }
    amqpvalue_destroy(map);
  }
  return l._4_4_;
}

Assistant:

static int attachServiceClientTypeToLink(LINK_HANDLE link)
{
    fields attach_properties;
    AMQP_VALUE serviceClientTypeKeyName;
    AMQP_VALUE serviceClientTypeValue;
    int result;

    if ((attach_properties = amqpvalue_create_map()) == NULL)
    {
        LogError("Failed to create the map for service client type.");
        result = MU_FAILURE;
    }
    else
    {
        if ((serviceClientTypeKeyName = amqpvalue_create_symbol("com.microsoft:client-version")) == NULL)
        {
            LogError("Failed to create the key name for the service client type.");
            result = MU_FAILURE;
        }
        else
        {
            if ((serviceClientTypeValue = amqpvalue_create_string(IOTHUB_SERVICE_CLIENT_TYPE_PREFIX IOTHUB_SERVICE_CLIENT_BACKSLASH IOTHUB_SERVICE_CLIENT_VERSION)) == NULL)
            {
                LogError("Failed to create the key value for the service client type.");
                result = MU_FAILURE;
            }
            else
            {
                if ((result = amqpvalue_set_map_value(attach_properties, serviceClientTypeKeyName, serviceClientTypeValue)) != 0)
                {
                    LogError("Failed to set the property map for the service client type.  Error code is: %d", result);
                }
                else if ((result = link_set_attach_properties(link, attach_properties)) != 0)
                {
                    LogError("Unable to attach the service client type to the link properties. Error code is: %d", result);
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(serviceClientTypeValue);
            }

            amqpvalue_destroy(serviceClientTypeKeyName);
        }

        amqpvalue_destroy(attach_properties);
    }
    return result;
}